

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O0

int LZ4_compress_HC_destSize
              (void *state,char *source,char *dest,int *sourceSizePtr,int targetDestSize,int cLevel)

{
  LZ4_streamHC_t *LZ4_streamHCPtr;
  LZ4_streamHC_t *ctx;
  int cLevel_local;
  int targetDestSize_local;
  int *sourceSizePtr_local;
  char *dest_local;
  char *source_local;
  void *state_local;
  
  LZ4_streamHCPtr = LZ4_initStreamHC(state,0x40038);
  if (LZ4_streamHCPtr == (LZ4_streamHC_t *)0x0) {
    state_local._4_4_ = 0;
  }
  else {
    LZ4HC_init_internal(&LZ4_streamHCPtr->internal_donotuse,(BYTE *)source);
    LZ4_setCompressionLevel(LZ4_streamHCPtr,cLevel);
    state_local._4_4_ =
         LZ4HC_compress_generic
                   (&LZ4_streamHCPtr->internal_donotuse,source,dest,sourceSizePtr,targetDestSize,
                    cLevel,fillOutput);
  }
  return state_local._4_4_;
}

Assistant:

int LZ4_compress_HC_destSize(void* state, const char* source, char* dest, int* sourceSizePtr, int targetDestSize, int cLevel)
{
    LZ4_streamHC_t* const ctx = LZ4_initStreamHC(state, sizeof(*ctx));
    if (ctx==NULL) return 0;   /* init failure */
    LZ4HC_init_internal(&ctx->internal_donotuse, (const BYTE*) source);
    LZ4_setCompressionLevel(ctx, cLevel);
    return LZ4HC_compress_generic(&ctx->internal_donotuse, source, dest, sourceSizePtr, targetDestSize, cLevel, fillOutput);
}